

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall Hero::Hero(Hero *this,int _hp,int _mp,int _atk,int _ap)

{
  Entity::Entity(&this->super_Entity,_hp,_mp,_atk);
  Skill::Skill(&this->super_Skill,_atk);
  this->ap = _ap;
  return;
}

Assistant:

Hero::Hero(int _hp,int _mp,int _atk,int _ap) : Entity(_hp,_mp,_atk),Skill(_atk){
    ap = _ap;
}